

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

int ohitmon(monst *magr,monst *mtmp,obj *otmp,obj *ostack,int range,boolean verbose)

{
  byte bVar1;
  boolean bVar2;
  uchar aatyp;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  obj *poVar8;
  bool bVar9;
  int local_74;
  int objgone;
  boolean ismimic;
  int iStack_3c;
  boolean vis;
  int tmp;
  int damage;
  boolean verbose_local;
  int range_local;
  obj *ostack_local;
  obj *otmp_local;
  monst *mtmp_local;
  monst *magr_local;
  
  bVar9 = false;
  if (mtmp->m_ap_type != '\0') {
    bVar9 = mtmp->m_ap_type != '\x03';
  }
  bVar1 = viz_array[bhitpos.y][bhitpos.x] & 2;
  iVar3 = find_mac(mtmp);
  iVar4 = omon_adj(mtmp,otmp,'\0');
  iVar5 = rnd(0x14);
  if (iVar3 + 5 + iVar4 < iVar5) {
    if (!bVar9) {
      if (bVar1 == 0) {
        if (verbose != '\0') {
          pline("It is missed.");
        }
      }
      else {
        pcVar6 = distant_name(otmp,mshot_xname);
        miss(pcVar6,mtmp);
      }
    }
    if (range == 0) {
      drop_throw(magr,otmp,ostack,'\0','\0',(int)mtmp->mx,(int)mtmp->my);
      return 1;
    }
    return 0;
  }
  if (otmp->oclass == '\b') {
    if (bVar9) {
      seemimic(mtmp);
    }
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
    if (bVar1 != 0) {
      *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffffdf | 0x20;
    }
    potionhit(mtmp,otmp,'\0');
    return 1;
  }
  iStack_3c = dmgval(magr,otmp,'\x01',mtmp);
  if ((otmp->otyp == 0x219) && ((mtmp->mintrinsics & 0x40) != 0)) {
    iStack_3c = 0;
  }
  if (bVar9) {
    seemimic(mtmp);
  }
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
  if (bVar1 == 0) {
    if (verbose != '\0') {
      pcVar6 = Monnam(mtmp);
      pcVar7 = exclam(iStack_3c);
      pline("%s is hit%s",pcVar6,pcVar7);
    }
  }
  else {
    pcVar6 = distant_name(otmp,mshot_xname);
    pcVar7 = exclam(iStack_3c);
    hit(pcVar6,'\0',mtmp,pcVar7);
  }
  if (((((mtmp->data == mons + 0xdb) && ((*(uint *)&mtmp->field_0x60 >> 8 & 1) == 0)) &&
       (6 < mtmp->mhp)) &&
      ((objects[otmp->otyp].oc_oprop != '\x04' && (bVar2 = obj_resists(otmp,5,0x32), bVar2 == '\0'))
      )) && (bVar2 = is_quest_artifact(otmp), bVar2 == '\0')) {
    if ((int)otmp->owt < 0x65) {
      local_74 = 1;
    }
    else {
      local_74 = (int)otmp->owt / 100;
    }
    iStack_3c = rnd(local_74);
    if (6 < iStack_3c) {
      iStack_3c = 6;
    }
    mtmp->mhp = mtmp->mhp - iStack_3c;
    if (bVar1 != 0) {
      pline("It disintegrates!");
    }
    obfree(otmp,(obj *)0x0);
    return 1;
  }
  if ((((*(uint *)&otmp->field_0x4a >> 0xf & 1) != 0) && (otmp->oclass == '\x02')) &&
     ((-0x1b < objects[otmp->otyp].oc_subtyp && (objects[otmp->otyp].oc_subtyp < -0x15)))) {
    if ((mtmp->mintrinsics & 0x20) == 0) {
      iVar3 = rn2(0x1e);
      if (iVar3 == 0) {
        if (bVar1 != 0) {
          pline("The poison was deadly...");
        }
        iStack_3c = mtmp->mhp;
      }
      else {
        iVar3 = rnd(6);
        iStack_3c = iVar3 + iStack_3c;
      }
    }
    else if (bVar1 != 0) {
      mon_nam(mtmp);
      pline("The poison doesn\'t seem to affect %s.");
    }
  }
  if (((*(ushort *)&objects[otmp->otyp].field_0x11 >> 4 & 0x1f) == 0xe) &&
     (bVar2 = hates_silver(mtmp->data), bVar2 != '\0')) {
    if (bVar1 == 0) {
      if (verbose != '\0') {
        pline("Its flesh is seared!");
      }
    }
    else {
      pcVar6 = mon_nam(mtmp);
      s_suffix(pcVar6);
      pline("The silver sears %s flesh!");
    }
  }
  if ((otmp->otyp == 0x219) && ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) {
    if ((mtmp->mintrinsics & 0x40) == 0) {
      if (bVar1 == 0) {
        if (verbose != '\0') {
          pline("It is burned!");
        }
      }
      else {
        mon_nam(mtmp);
        pline("The acid burns %s!");
      }
    }
    else {
      if ((bVar1 != 0) || (verbose != '\0')) {
        Monnam(mtmp);
        pline("%s is unaffected.");
      }
      iStack_3c = 0;
    }
  }
  mtmp->mhp = mtmp->mhp - iStack_3c;
  if (0 < mtmp->mhp) goto LAB_0025bbf3;
  if ((bVar1 != 0) || (verbose != '\0')) {
    pcVar6 = Monnam(mtmp);
    bVar9 = true;
    if ((mtmp->data->mlet != '7') &&
       (((bVar9 = true, (mtmp->data->mflags2 & 2) == 0 && (bVar9 = true, mtmp->data->mlet != '\x16')
         ) && (bVar9 = true, mtmp->data != mons + 0x33)))) {
      if (mtmp->wormno == '\0') {
        if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            (((u.uprops[0x40].intrinsic != 0 ||
              ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
             (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)))))
            ))) goto LAB_0025b900;
LAB_0025b992:
        if (((mtmp->data->mflags1 & 0x10000) == 0) &&
           ((poVar8 = which_armor(mtmp,4), poVar8 == (obj *)0x0 ||
            (poVar8 = which_armor(mtmp,4), poVar8->otyp != 0x4f)))) {
          if (((((u.uprops[0x1e].intrinsic != 0) ||
                (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
               ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
              ((((u.uprops[0x19].intrinsic != 0 ||
                 ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
                (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))) &&
             (bVar9 = true, u.uprops[0x19].blocked == 0)) goto LAB_0025bb75;
          if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
            iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
            bVar9 = true;
            if (iVar3 < 0x41) goto LAB_0025bb75;
          }
        }
        bVar9 = true;
        if ((u.uprops[0x42].intrinsic == 0) && (bVar9 = true, u.uprops[0x42].extrinsic == 0)) {
          bVar2 = match_warn_of_mon(mtmp);
          bVar9 = bVar2 != '\0';
        }
      }
      else {
        bVar2 = worm_known(level,mtmp);
        if (bVar2 == '\0') goto LAB_0025b992;
LAB_0025b900:
        if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
           ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 ||
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)) ||
            (bVar9 = true, ((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_0025b992;
      }
LAB_0025bb75:
      bVar9 = (bool)(bVar9 ^ 1);
    }
    pcVar7 = "killed";
    if (bVar9) {
      pcVar7 = "destroyed";
    }
    pline("%s is %s!",pcVar6,pcVar7);
  }
  if ((flags.mon_moving == '\0') &&
     (((otmp->otyp != 0x214 || (-1 < range)) || ((*(uint *)&otmp->field_0x4a >> 0xf & 1) != 0)))) {
    xkilled(mtmp,0);
  }
  else {
    mondied(mtmp);
  }
LAB_0025bbf3:
  aatyp = 0xfe;
  if (otmp->otyp == 0x218) {
    aatyp = '\n';
  }
  bVar2 = can_blnd((monst *)0x0,mtmp,aatyp,otmp);
  if (bVar2 != '\0') {
    if ((bVar1 != 0) && ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) != 0)) {
      pcVar6 = Monnam(mtmp);
      pcVar7 = xname(otmp);
      pcVar7 = the(pcVar7);
      pline("%s is blinded by %s.",pcVar6,pcVar7);
    }
    *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfffdffff;
    bVar1 = mtmp->mblinded;
    iVar3 = rnd(0x19);
    objgone = (uint)bVar1 + iVar3 + 0x14;
    if (0x7f < objgone) {
      objgone = 0x7f;
    }
    mtmp->mblinded = (uchar)objgone;
  }
  iVar3 = drop_throw(magr,otmp,ostack,'\x01','\x01',(int)bhitpos.x,(int)bhitpos.y);
  if ((iVar3 == 0) && (range == -1)) {
    obj_extract_self(otmp);
    magr_local._4_4_ = 0;
  }
  else {
    magr_local._4_4_ = 1;
  }
  return magr_local._4_4_;
}

Assistant:

int ohitmon(struct monst *magr,	/* thrower/firer, if any */
	    struct monst *mtmp,	/* accidental target */
	    struct obj *otmp,	/* missile; might be destroyed by drop_throw */
	    struct obj *ostack,	/* stack from which otmp came, if any */
	    int range,		/* how much farther will object travel if it misses */
				/* Use -1 to signify to keep going even after hit, */
				/* unless its gone (used for rolling_boulder_traps) */
	    boolean verbose)	/* give message(s) even when you can't see what happened */
{
	int damage, tmp;
	boolean vis, ismimic;
	int objgone = 1;

	ismimic = mtmp->m_ap_type && mtmp->m_ap_type != M_AP_MONSTER;
	vis = cansee(bhitpos.x, bhitpos.y);

	tmp = 5 + find_mac(mtmp) + omon_adj(mtmp, otmp, FALSE);
	if (tmp < rnd(20)) {
	    if (!ismimic) {
		if (vis) miss(distant_name(otmp, mshot_xname), mtmp);
		else if (verbose) pline("It is missed.");
	    }
	    if (!range) { /* Last position; object drops */
		drop_throw(magr, otmp, ostack, FALSE, FALSE,
			   mtmp->mx, mtmp->my);
		return 1;
	    }
	} else if (otmp->oclass == POTION_CLASS) {
	    if (ismimic) seemimic(mtmp);
	    mtmp->msleeping = 0;
	    if (vis) otmp->dknown = 1;
	    potionhit(mtmp, otmp, FALSE);
	    return 1;
	} else {
	    damage = dmgval(magr, otmp, TRUE, mtmp);
	    if (otmp->otyp == ACID_VENOM && resists_acid(mtmp))
		damage = 0;
	    if (ismimic) seemimic(mtmp);
	    mtmp->msleeping = 0;
	    if (vis) hit(distant_name(otmp,mshot_xname), FALSE, mtmp, exclam(damage));
	    else if (verbose) pline("%s is hit%s", Monnam(mtmp), exclam(damage));

	    if (touch_disintegrates(mtmp->data) && !mtmp->mcan && mtmp->mhp > 6 &&
		!oresist_disintegration(otmp)) {
		damage = otmp->owt;
		weight_dmg(damage);
		mtmp->mhp -= damage;
		if (vis) pline("It disintegrates!");
		obfree(otmp, NULL);
		return 1;
	    }

	    if (otmp->opoisoned && is_poisonable(otmp)) {
		if (resists_poison(mtmp)) {
		    if (vis) pline("The poison doesn't seem to affect %s.",
				   mon_nam(mtmp));
		} else {
		    if (rn2(30)) {
			damage += rnd(6);
		    } else {
			if (vis) pline("The poison was deadly...");
			damage = mtmp->mhp;
		    }
		}
	    }
	    if (objects[otmp->otyp].oc_material == SILVER &&
		    hates_silver(mtmp->data)) {
		if (vis) pline("The silver sears %s flesh!",
				s_suffix(mon_nam(mtmp)));
		else if (verbose) pline("Its flesh is seared!");
	    }
	    if (otmp->otyp == ACID_VENOM && cansee(mtmp->mx,mtmp->my)) {
		if (resists_acid(mtmp)) {
		    if (vis || verbose)
			pline("%s is unaffected.", Monnam(mtmp));
		    damage = 0;
		} else {
		    if (vis) pline("The acid burns %s!", mon_nam(mtmp));
		    else if (verbose) pline("It is burned!");
		}
	    }
	    mtmp->mhp -= damage;
	    if (mtmp->mhp < 1) {
		if (vis || verbose)
		    pline("%s is %s!", Monnam(mtmp),
			(nonliving(mtmp->data) || !canspotmon(level, mtmp))
			? "destroyed" : "killed");
		/* don't blame hero for unknown rolling boulder trap */
		if (!flags.mon_moving &&
		    (otmp->otyp != BOULDER || range >= 0 || otmp->otrapped))
		    xkilled(mtmp,0);
		else mondied(mtmp);
	    }

	    if (can_blnd(NULL, mtmp,
		    (uchar)(otmp->otyp == BLINDING_VENOM ? AT_SPIT : AT_WEAP),
		    otmp)) {
		if (vis && mtmp->mcansee)
		    pline("%s is blinded by %s.", Monnam(mtmp), the(xname(otmp)));
		mtmp->mcansee = 0;
		tmp = (int)mtmp->mblinded + rnd(25) + 20;
		if (tmp > 127) tmp = 127;
		mtmp->mblinded = tmp;
	    }

	    objgone = drop_throw(magr, otmp, ostack, TRUE, TRUE,
				 bhitpos.x, bhitpos.y);
	    if (!objgone && range == -1) {  /* special case */
		    obj_extract_self(otmp); /* free it for motion again */
		    return 0;
	    }
	    return 1;
	}
	return 0;
}